

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_LOOP(Context *ctx)

{
  Context *ctx_local;
  
  if (ctx->source_args[0].regtype == REG_TYPE_LOOP) {
    if (ctx->source_args[1].regtype == REG_TYPE_CONSTINT) {
      ctx->loops = ctx->loops + 1;
    }
    else {
      fail(ctx,"LOOP argument isn\'t constint register");
    }
  }
  else {
    fail(ctx,"LOOP argument isn\'t loop register");
  }
  return;
}

Assistant:

static void state_LOOP(Context *ctx)
{
    if (ctx->source_args[0].regtype != REG_TYPE_LOOP)
        fail(ctx, "LOOP argument isn't loop register");
    else if (ctx->source_args[1].regtype != REG_TYPE_CONSTINT)
        fail(ctx, "LOOP argument isn't constint register");
    else
        ctx->loops++;
}